

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
                  *this,Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                        *xpr,Index startRow,Index startCol,Index blockRows,Index blockCols)

{
  Scalar *pSVar1;
  Index IVar2;
  Index IVar3;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *xpr_local;
  BlockImpl_dense<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
  *this_local;
  
  pSVar1 = MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_0>
           ::data((MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
                   *)xpr);
  IVar2 = BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true,_true>
          ::innerStride((BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
                         *)xpr);
  IVar3 = BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true,_true>
          ::outerStride((BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
                         *)xpr);
  MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
            ,pSVar1 + IVar2 * startRow + IVar3 * startCol,blockRows,blockCols);
  Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>
  ::Block(&this->m_xpr,xpr);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,startRow);
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x78,startCol);
  init(this,(EVP_PKEY_CTX *)startCol);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }